

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

_outconnect *
obj_nexttraverseoutlet(_outconnect *lastconnect,t_object **destp,_inlet **inletp,int *whichp)

{
  t_object *ptVar1;
  t_object *ptVar2;
  t_object *dest;
  _inlet *i2;
  _inlet *i;
  int n;
  t_pd *y;
  int *whichp_local;
  _inlet **inletp_local;
  t_object **destp_local;
  _outconnect *lastconnect_local;
  
  ptVar1 = (t_object *)lastconnect->oc_to;
  if (((((ptVar1->te_g).g_pd == inlet_class) || ((ptVar1->te_g).g_pd == pointerinlet_class)) ||
      ((ptVar1->te_g).g_pd == floatinlet_class)) || ((ptVar1->te_g).g_pd == symbolinlet_class)) {
    ptVar2 = (t_object *)ptVar1->te_binbuf;
    i._4_4_ = (int)((ptVar2->te_g).g_pd)->c_firstin;
    for (dest = (t_object *)ptVar2->te_inlet; dest != (t_object *)0x0 && dest != ptVar1;
        dest = (t_object *)(dest->te_g).g_next) {
      i._4_4_ = i._4_4_ + 1;
    }
    *whichp = i._4_4_;
    *destp = ptVar2;
    *inletp = (_inlet *)ptVar1;
  }
  else {
    *whichp = 0;
    *inletp = (_inlet *)0x0;
    *destp = ptVar1;
  }
  return lastconnect->oc_next;
}

Assistant:

t_outconnect *obj_nexttraverseoutlet(t_outconnect *lastconnect,
    t_object **destp, t_inlet **inletp, int *whichp)
{
    t_pd *y;
    y = lastconnect->oc_to;
    if (ISINLET(y))
    {
        int n;
        t_inlet *i = (t_inlet *)y, *i2;
        t_object *dest = i->i_owner;
        for (n = dest->ob_pd->c_firstin, i2 = dest->ob_inlet;
            i2 && i2 != i; i2 = i2->i_next) n++;
        *whichp = n;
        *destp = dest;
        *inletp = i;
    }
    else
    {
        *whichp = 0;
        *inletp = 0;
        *destp = ((t_object *)y);
    }
    return (lastconnect->oc_next);
}